

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O2

Var Js::HelperMethodWrapper13
              (ScriptContext *scriptContext,void *origHelperAddr,Var arg1,Var arg2,Var arg3,Var arg4
              ,Var arg5,Var arg6,Var arg7,Var arg8,Var arg9,Var arg10,Var arg11,Var arg12,Var arg13)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  long lVar5;
  anon_class_112_14_4cb0d2ea *paVar6;
  anon_class_112_14_4cb0d2ea *paVar7;
  byte bVar8;
  anon_class_112_14_4cb0d2ea local_128;
  anon_class_112_14_4cb0d2ea local_b8;
  Var local_48;
  ScriptContext *local_40;
  AutoRegisterIgnoreExceptionWrapper local_38;
  
  bVar8 = 0;
  if (origHelperAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    local_48 = arg4;
    local_40 = scriptContext;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0xb2,"(origHelperAddr)","origHelperAddr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    arg4 = local_48;
    scriptContext = local_40;
  }
  local_b8.arg5 = arg5;
  local_b8.arg6 = arg6;
  local_b8.arg7 = arg7;
  local_b8.arg8 = arg8;
  local_b8.arg9 = arg9;
  local_b8.arg10 = arg10;
  local_b8.arg11 = arg11;
  local_b8.arg12 = arg12;
  local_b8.arg13 = arg13;
  local_b8.origHelperAddr = origHelperAddr;
  local_b8.arg1 = arg1;
  local_b8.arg2 = arg2;
  local_b8.arg3 = arg3;
  local_b8.arg4 = arg4;
  bVar2 = AutoRegisterIgnoreExceptionWrapper::IsRegistered(scriptContext->threadContext);
  if (bVar2) {
    pvVar4 = HelperMethodWrapper13::anon_class_112_14_4cb0d2ea::operator()(&local_b8);
  }
  else {
    AutoRegisterIgnoreExceptionWrapper::AutoRegisterIgnoreExceptionWrapper
              (&local_38,scriptContext->threadContext);
    paVar6 = &local_b8;
    paVar7 = &local_128;
    for (lVar5 = 0xe; lVar5 != 0; lVar5 = lVar5 + -1) {
      paVar7->origHelperAddr = paVar6->origHelperAddr;
      paVar6 = (anon_class_112_14_4cb0d2ea *)((long)paVar6 + ((ulong)bVar8 * -2 + 1) * 8);
      paVar7 = (anon_class_112_14_4cb0d2ea *)((long)paVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    pvVar4 = HelperMethodWrapper13::anon_class_112_14_4cb0d2ea::operator()(&local_128);
    AutoRegisterIgnoreExceptionWrapper::~AutoRegisterIgnoreExceptionWrapper(&local_38);
  }
  return pvVar4;
}

Assistant:

Var HelperMethodWrapper13(ScriptContext* scriptContext, void* origHelperAddr, Var arg1, Var arg2, Var arg3, Var arg4, Var arg5, Var arg6, Var arg7, Var arg8, Var arg9, Var arg10, Var arg11, Var arg12, Var arg13)
    {
        Assert(origHelperAddr);
        return HelperMethodWrapper(scriptContext, [=] {
            return ((OrigHelperMethod13)origHelperAddr)(arg1, arg2, arg3, arg4, arg5, arg6, arg7, arg8, arg9, arg10, arg11, arg12, arg13);
        });
    }